

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::AllocateLoopHeaders(ByteCodeWriter *this)

{
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  Type pLVar2;
  undefined8 uVar3;
  LoopHeader *pLVar4;
  long lVar5;
  long lVar6;
  
  FunctionBody::AllocateLoopHeaders(this->m_functionWrite);
  pLVar1 = this->m_loopHeaders;
  if (0 < (pLVar1->
          super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
          ).count) {
    lVar5 = 9;
    lVar6 = 0;
    do {
      pLVar2 = (pLVar1->
               super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
               ).buffer;
      pLVar4 = FunctionBody::GetLoopHeader(this->m_functionWrite,(uint)lVar6);
      uVar3 = *(undefined8 *)((long)pLVar2 + lVar5 + -9);
      pLVar4->startOffset = (int)uVar3;
      pLVar4->endOffset = (int)((ulong)uVar3 >> 0x20);
      pLVar4->isNested = *(Type *)((long)pLVar2 + lVar5 + -1);
      pLVar4->hasYield = *(Type *)((long)&pLVar2->startOffset + lVar5);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar6 < (pLVar1->
                     super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
                     ).count);
  }
  return;
}

Assistant:

void ByteCodeWriter::AllocateLoopHeaders()
    {
        m_functionWrite->AllocateLoopHeaders();
        m_loopHeaders->Map([this](int index, ByteCodeWriter::LoopHeaderData& data)
        {
            LoopHeader *loopHeader = m_functionWrite->GetLoopHeader(index);
            loopHeader->startOffset = data.startOffset;
            loopHeader->endOffset = data.endOffset;
            loopHeader->isNested = data.isNested;
            loopHeader->hasYield = data.hasYield;
        });
    }